

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O2

void __thiscall spdlog::logger::swap(logger *this,logger *other)

{
  __int_type_conflict _Var1;
  
  std::__cxx11::string::swap((string *)&this->name_);
  std::
  _Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->sinks_,(_Vector_impl_data *)&other->sinks_);
  LOCK();
  _Var1 = (this->level_).super___atomic_base<int>._M_i;
  (this->level_).super___atomic_base<int>._M_i = (other->level_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (other->level_).super___atomic_base<int>._M_i = _Var1;
  UNLOCK();
  LOCK();
  _Var1 = (this->flush_level_).super___atomic_base<int>._M_i;
  (this->flush_level_).super___atomic_base<int>._M_i =
       (other->flush_level_).super___atomic_base<int>._M_i;
  UNLOCK();
  LOCK();
  (other->flush_level_).super___atomic_base<int>._M_i = _Var1;
  UNLOCK();
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::swap(&this->custom_err_handler_,&other->custom_err_handler_);
  std::swap<spdlog::details::backtracer>(&this->tracer_,&other->tracer_);
  return;
}

Assistant:

SPDLOG_INLINE void logger::swap(spdlog::logger &other) SPDLOG_NOEXCEPT
{
    name_.swap(other.name_);
    sinks_.swap(other.sinks_);

    // swap level_
    auto other_level = other.level_.load();
    auto my_level = level_.exchange(other_level);
    other.level_.store(my_level);

    // swap flush level_
    other_level = other.flush_level_.load();
    my_level = flush_level_.exchange(other_level);
    other.flush_level_.store(my_level);

    custom_err_handler_.swap(other.custom_err_handler_);
    std::swap(tracer_, other.tracer_);
}